

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O0

wchar_t archive_mstring_get_mbs_l
                  (archive_mstring *aes,char **p,size_t *length,archive_string_conv *sc)

{
  int *piVar1;
  void *in_RCX;
  archive_string *in_RDX;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  wchar_t *unaff_retaddr;
  wchar_t ret;
  wchar_t r;
  archive_string_conv *in_stack_ffffffffffffffc8;
  wchar_t wVar2;
  wchar_t in_stack_ffffffffffffffd4;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  wVar2 = L'\0';
  if (((*(uint *)(in_RDI + 0xc) & 1) == 0) && ((*(uint *)(in_RDI + 0xc) & 4) != 0)) {
    in_RDI[1] = 0;
    in_stack_ffffffffffffffd4 =
         archive_string_append_from_wcs
                   (_ret,unaff_retaddr,CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
                   );
    if (in_stack_ffffffffffffffd4 == L'\0') {
      *(uint *)(in_RDI + 0xc) = *(uint *)(in_RDI + 0xc) | 1;
    }
    else {
      piVar1 = __errno_location();
      if (*piVar1 == 0xc) {
        return L'\xffffffff';
      }
      wVar2 = L'\xffffffff';
    }
  }
  if ((*(uint *)(in_RDI + 0xc) & 1) == 0) {
    *in_RSI = 0;
    if (in_RDX != (archive_string *)0x0) {
      in_RDX->s = (char *)0x0;
    }
  }
  else if (in_RCX == (void *)0x0) {
    *in_RSI = *in_RDI;
    if (in_RDX != (archive_string *)0x0) {
      in_RDX->s = (char *)in_RDI[1];
    }
    wVar2 = L'\0';
  }
  else {
    wVar2 = archive_strncpy_l(in_RDX,in_RCX,CONCAT44(in_stack_ffffffffffffffd4,wVar2),
                              in_stack_ffffffffffffffc8);
    *in_RSI = in_RDI[9];
    if (in_RDX != (archive_string *)0x0) {
      in_RDX->s = (char *)in_RDI[10];
    }
  }
  return wVar2;
}

Assistant:

int
archive_mstring_get_mbs_l(struct archive_mstring *aes,
    const char **p, size_t *length, struct archive_string_conv *sc)
{
	int r, ret = 0;

#if defined(_WIN32) && !defined(__CYGWIN__)
	/*
	 * Internationalization programing on Windows must use Wide
	 * characters because Windows platform cannot make locale UTF-8.
	 */
	if (sc != NULL && (aes->aes_set & AES_SET_WCS) != 0) {
		archive_string_empty(&(aes->aes_mbs_in_locale));
		r = archive_string_append_from_wcs_in_codepage(
		    &(aes->aes_mbs_in_locale), aes->aes_wcs.s,
		    aes->aes_wcs.length, sc);
		if (r == 0) {
			*p = aes->aes_mbs_in_locale.s;
			if (length != NULL)
				*length = aes->aes_mbs_in_locale.length;
			return (0);
		} else if (errno == ENOMEM)
			return (-1);
		else
			ret = -1;
	}
#endif

	/* If there is not an MBS form but is a WCS form, try converting
	 * with the native locale to be used for translating it to specified
	 * character-set. */
	if ((aes->aes_set & AES_SET_MBS) == 0 &&
	    (aes->aes_set & AES_SET_WCS) != 0) {
		archive_string_empty(&(aes->aes_mbs));
		r = archive_string_append_from_wcs(&(aes->aes_mbs),
		    aes->aes_wcs.s, aes->aes_wcs.length);
		if (r == 0)
			aes->aes_set |= AES_SET_MBS;
		else if (errno == ENOMEM)
			return (-1);
		else
			ret = -1;
	}
	/* If we already have an MBS form, use it to be translated to
	 * specified character-set. */
	if (aes->aes_set & AES_SET_MBS) {
		if (sc == NULL) {
			/* Conversion is unneeded. */
			*p = aes->aes_mbs.s;
			if (length != NULL)
				*length = aes->aes_mbs.length;
			return (0);
		}
		ret = archive_strncpy_l(&(aes->aes_mbs_in_locale),
		    aes->aes_mbs.s, aes->aes_mbs.length, sc);
		*p = aes->aes_mbs_in_locale.s;
		if (length != NULL)
			*length = aes->aes_mbs_in_locale.length;
	} else {
		*p = NULL;
		if (length != NULL)
			*length = 0;
	}
	return (ret);
}